

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::VisibilityGroup> *
metaf::VisibilityGroup::parse
          (optional<metaf::VisibilityGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  int iVar1;
  long lVar2;
  optional<metaf::Distance> v;
  _Storage<metaf::Distance,_true> local_48;
  char local_38;
  
  if (reportPart == RMK) {
    iVar1 = std::__cxx11::string::compare((char *)group);
    if (iVar1 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText = VIS;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)group);
      if (iVar1 == 0) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 5;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)group);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)group);
          if (iVar1 == 0) {
            *(undefined8 *)
             &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0xf;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
            (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
            incompleteText = NONE;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)group);
            if (iVar1 == 0) {
              *(undefined8 *)
               &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
                _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0x10;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
              (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
              incompleteText = VISNO;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)group);
              if (iVar1 != 0) goto LAB_001ad504;
              *(undefined8 *)
               &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
                _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0xe;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
              *(undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
              (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
              incompleteText = RVR;
            }
          }
          goto LAB_001ad4e8;
        }
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 6;
      }
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText =
           SFC_OR_TWR;
    }
  }
  else {
    if ((reportPart & ~HEADER) != METAR) {
LAB_001ad504:
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged = false;
      return __return_storage_ptr__;
    }
    if ((((group->_M_string_length - 4 < 0xfffffffffffffffd) ||
         (lVar2 = std::__cxx11::string::find((char)group,0x2f), lVar2 != -1)) ||
        (Distance::fromMileString((optional<metaf::Distance> *)&local_48._M_value,group,true),
        local_38 == '\0')) || (local_48._M_value.distModifier != NONE)) {
      *(undefined1 (*) [16])
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x50) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x40) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visMax.
        distUnit = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.vis.
        distUnit = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload =
           (undefined1  [16])0x0;
      fromMeters(__return_storage_ptr__,group);
      if ((__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false) {
        return __return_storage_ptr__;
      }
      Distance::fromMileString((optional<metaf::Distance> *)&local_48._M_value,group,false);
      if (local_38 == '\0') {
        if ((reportPart == METAR) &&
           (fromRvr(__return_storage_ptr__,group),
           (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
           _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false)) {
          return __return_storage_ptr__;
        }
        goto LAB_001ad504;
      }
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xf) =
           local_48._11_1_;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xd) =
           local_48._9_2_;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visType = PREVAILING;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                        super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 4) =
           CONCAT44(local_48._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload
                    .super__Optional_payload_base<unsigned_int>._M_payload._M_value,
                    local_48._M_value.distModifier);
      *(bool *)((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) =
           local_48._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.vis.distUnit =
           local_48._M_value.distUnit;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visMax.distModifier =
           NONE;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText = NONE
      ;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visType = PREVAILING;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.vis.distModifier =
           NONE;
      *(_Storage<unsigned_int,_true> *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.vis.dist
        .super__Optional_base<unsigned_int,_true,_true> =
           (uint)local_48._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
               vis.dist.super__Optional_base<unsigned_int,_true,_true> + 4) = local_48._8_4_;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.vis.distUnit =
           local_48._M_value.distUnit;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visMax.distModifier =
           NONE;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText =
           INTEGER;
    }
  }
LAB_001ad4e8:
  (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<VisibilityGroup> VisibilityGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (reportPart == ReportPart::RMK) {
		if (group == "VIS") 
			return VisibilityGroup(Type::PREVAILING, IncompleteText::VIS);
		if (group == "SFC")
			return VisibilityGroup(Type::SURFACE, IncompleteText::SFC_OR_TWR);
		if (group == "TWR")
			return VisibilityGroup(Type::TOWER, IncompleteText::SFC_OR_TWR);
		if (group == "RVRNO") 
			return VisibilityGroup(Type::RVRNO, IncompleteText::NONE);
		if (group == "VISNO") 
			return VisibilityGroup(Type::VISNO, IncompleteText::VISNO);
		if (group == "RVR") 
			return VisibilityGroup(Type::RVR_MISG, IncompleteText::RVR);
	}
	if (reportPart == ReportPart::METAR || reportPart == ReportPart::TAF) {
		if (const auto v = fromIncompleteInteger(group); v.has_value()) return v;
		if (const auto v = fromMeters(group); v.has_value()) return v;
		if (const auto v = Distance::fromMileString(group); v.has_value()) {
			VisibilityGroup result;
			result.vis = *v;
			return result;
		}
	}
	if (reportPart == ReportPart::METAR) {
		if (const auto v = fromRvr(group); v.has_value()) return v;
	}
	return std::optional<VisibilityGroup>();
}